

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeHeap.cpp
# Opt level: O2

void __thiscall wasm::SafeHeap::addLoadFunc(SafeHeap *this,Load style,Module *module)

{
  ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *this_00;
  MixedArena *this_01;
  Module *pMVar1;
  Type indexType;
  Module *module_00;
  Function *pFVar2;
  Memory *pMVar3;
  LocalGet *pLVar4;
  LocalGet *right;
  Binary *value;
  LocalSet *item;
  Expression *pEVar5;
  Load *this_02;
  Load *item_00;
  BinaryOp op;
  initializer_list<wasm::Type> types;
  Signature sig;
  initializer_list<wasm::Type> __l;
  Name NVar6;
  Name name;
  Type local_90;
  Type local_88;
  HeapType local_80;
  Module *local_78;
  SafeHeap *local_70;
  Type local_68;
  Builder builder;
  _Head_base<0UL,_wasm::Function_*,_false> local_50;
  unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> func;
  allocator_type local_31;
  
  NVar6 = getLoadName(&style);
  pFVar2 = Module::getFunctionOrNull(module,NVar6);
  if (pFVar2 == (Function *)0x0) {
    local_78 = module;
    local_70 = this;
    pMVar3 = Module::getMemory(module,style.memory);
    pMVar1 = (Module *)(pMVar3->indexType).id;
    types._M_len = 2;
    types._M_array = &stack0xffffffffffffff98;
    local_68.id = (uintptr_t)pMVar1;
    builder.wasm = pMVar1;
    wasm::Type::Type(&local_90,types);
    sig.results.id =
         style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression.type.id;
    sig.params.id = local_90.id;
    HeapType::HeapType(&local_80,sig);
    __l._M_len = 1;
    __l._M_array = &local_88;
    local_88.id = (uintptr_t)pMVar1;
    std::vector<wasm::Type,_std::allocator<wasm::Type>_>::vector
              ((vector<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffff98,__l,
               &local_31);
    name.super_IString.str._M_str = NVar6.super_IString.str._M_len;
    name.super_IString.str._M_len = (size_t)&local_50;
    Builder::makeFunction
              (name,(HeapType)NVar6.super_IString.str._M_str,
               (vector<wasm::Type,_std::allocator<wasm::Type>_> *)local_80.id,
               (Expression *)&stack0xffffffffffffff98);
    std::_Vector_base<wasm::Type,_std::allocator<wasm::Type>_>::~_Vector_base
              ((_Vector_base<wasm::Type,_std::allocator<wasm::Type>_> *)&stack0xffffffffffffff98);
    module_00 = local_78;
    local_68.id = (uintptr_t)local_78;
    this_01 = &local_78->allocator;
    func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
    super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
    super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl =
         (__uniq_ptr_data<wasm::Function,_std::default_delete<wasm::Function>,_true,_true>)
         MixedArena::alloc<wasm::Block>(this_01);
    op = AddInt64;
    if ((pMVar3->indexType).id != 3) {
      op = AddInt32;
    }
    pLVar4 = MixedArena::alloc<wasm::LocalGet>(this_01);
    pLVar4->index = 0;
    (pLVar4->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
         (uintptr_t)pMVar1;
    right = MixedArena::alloc<wasm::LocalGet>(this_01);
    right->index = 1;
    (right->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
         (uintptr_t)pMVar1;
    value = Builder::makeBinary((Builder *)&stack0xffffffffffffff98,op,(Expression *)pLVar4,
                                (Expression *)right);
    item = Builder::makeLocalSet((Builder *)&stack0xffffffffffffff98,2,(Expression *)value);
    this_00 = (ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*> *)
              ((long)func._M_t.
                     super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
                     super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl + 0x20);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (this_00,(Expression *)item);
    indexType.id = (pMVar3->indexType).id;
    pEVar5 = makeBoundsCheck(local_70,style.super_SpecificExpression<(wasm::Expression::Id)12>.
                                      super_Expression.type,(Builder *)&stack0xffffffffffffff98,2,
                             (uint)style.bytes,module_00,indexType,indexType.id == 3,
                             (Name)(pMVar3->super_Importable).super_Named.name.super_IString.str);
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back(this_00,pEVar5);
    if (1 < style.align.addr) {
      NVar6.super_IString.str._M_str._4_4_ =
           (int)((ulong)(pMVar3->super_Importable).super_Named.name.super_IString.str._M_str >> 0x20
                );
      NVar6.super_IString.str._0_12_ =
           *(undefined1 (*) [12])&(pMVar3->super_Importable).super_Named.name.super_IString.str;
      pEVar5 = makeAlignCheck(local_70,style.align,(Builder *)&stack0xffffffffffffff98,2,module_00,
                              NVar6);
      ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
                (this_00,pEVar5);
    }
    this_02 = MixedArena::alloc<wasm::Load>(this_01);
    Load::operator=(this_02,&style);
    pLVar4 = MixedArena::alloc<wasm::LocalGet>((MixedArena *)(local_68.id + 0x158));
    pLVar4->index = 2;
    (pLVar4->super_SpecificExpression<(wasm::Expression::Id)8>).super_Expression.type.id =
         (uintptr_t)pMVar1;
    this_02->ptr = (Expression *)pLVar4;
    item_00 = this_02;
    if ((this_02->isAtomic == true) && (this_02->signed_ == true)) {
      item_00 = (Load *)Bits::makeSignExt((Expression *)this_02,(uint)this_02->bytes,module_00);
      this_02->signed_ = false;
    }
    ArenaVectorBase<ArenaVector<wasm::Expression_*>,_wasm::Expression_*>::push_back
              (this_00,(Expression *)item_00);
    Block::finalize((Block *)func._M_t.
                             super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>
                             .super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl,
                    style.super_SpecificExpression<(wasm::Expression::Id)12>.super_Expression.type);
    (local_50._M_head_impl)->body =
         (Expression *)
         func._M_t.super___uniq_ptr_impl<wasm::Function,_std::default_delete<wasm::Function>_>._M_t.
         super__Tuple_impl<0UL,_wasm::Function_*,_std::default_delete<wasm::Function>_>.
         super__Head_base<0UL,_wasm::Function_*,_false>._M_head_impl;
    Module::addFunction(module_00,
                        (unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)
                        &local_50);
    std::unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_>::~unique_ptr
              ((unique_ptr<wasm::Function,_std::default_delete<wasm::Function>_> *)&local_50);
  }
  return;
}

Assistant:

void addLoadFunc(Load style, Module* module) {
    auto name = getLoadName(&style);
    if (module->getFunctionOrNull(name)) {
      return;
    }
    // pointer, offset
    auto memory = module->getMemory(style.memory);
    auto indexType = memory->indexType;
    auto funcSig = Signature({indexType, indexType}, style.type);
    auto func = Builder::makeFunction(name, funcSig, {indexType});
    Builder builder(*module);
    auto* block = builder.makeBlock();
    block->list.push_back(builder.makeLocalSet(
      2,
      builder.makeBinary(memory->is64() ? AddInt64 : AddInt32,
                         builder.makeLocalGet(0, indexType),
                         builder.makeLocalGet(1, indexType))));
    // check for reading past valid memory: if pointer + offset + bytes
    block->list.push_back(makeBoundsCheck(style.type,
                                          builder,
                                          2,
                                          style.bytes,
                                          module,
                                          memory->indexType,
                                          memory->is64(),
                                          memory->name));
    // check proper alignment
    if (style.align > 1) {
      block->list.push_back(
        makeAlignCheck(style.align, builder, 2, module, memory->name));
    }
    // do the load
    auto* load = module->allocator.alloc<Load>();
    *load = style; // basically the same as the template we are given!
    load->ptr = builder.makeLocalGet(2, indexType);
    Expression* last = load;
    if (load->isAtomic && load->signed_) {
      // atomic loads cannot be signed, manually sign it
      last = Bits::makeSignExt(load, load->bytes, *module);
      load->signed_ = false;
    }
    block->list.push_back(last);
    block->finalize(style.type);
    func->body = block;
    module->addFunction(std::move(func));
  }